

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O1

AffixMatcherWarehouse * __thiscall
icu_63::numparse::impl::AffixMatcherWarehouse::operator=
          (AffixMatcherWarehouse *this,AffixMatcherWarehouse *param_1)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  void *pvVar5;
  void *pvVar6;
  
  lVar4 = 8;
  do {
    *(undefined4 *)((long)&this->fAffixMatchers[0].fSuffix + lVar4) =
         *(undefined4 *)((long)&param_1->fAffixMatchers[0].fSuffix + lVar4);
    puVar1 = (undefined8 *)
             ((long)&param_1->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar4);
    uVar3 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)&this->fAffixMatchers[0].super_NumberParseMatcher._vptr_NumberParseMatcher +
             lVar4);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x128);
  lVar4 = 0;
  do {
    if (*(char *)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                 + lVar4 + -4) != '\0') {
      uprv_free_63(*(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.
                                    fMatchers.stackArray + lVar4 + -0x10));
    }
    pvVar5 = (void *)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                            stackArray + lVar4);
    *(undefined4 *)
     ((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
     lVar4 + -8) = *(undefined4 *)
                    ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                           stackArray + lVar4 + -8);
    *(undefined1 *)
     ((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
     lVar4 + -4) = *(undefined1 *)
                    ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                           stackArray + lVar4 + -4);
    pvVar6 = *(void **)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                              stackArray + lVar4 + -0x10);
    if (pvVar5 == pvVar6) {
      pvVar6 = (void *)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                              stackArray + lVar4);
      *(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                + lVar4 + -0x10) = pvVar6;
      memcpy(pvVar6,pvVar5,
             (long)*(int *)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.
                                  fMatchers.stackArray + lVar4 + -8) << 3);
    }
    else {
      *(void **)((long)this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray
                + lVar4 + -0x10) = pvVar6;
      *(void **)((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.
                       stackArray + lVar4 + -0x10) = pvVar5;
      *(undefined4 *)
       ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
       lVar4 + -8) = 3;
      *(undefined1 *)
       ((long)param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers.stackArray +
       lVar4 + -4) = 0;
    }
    *(undefined4 *)
     ((long)(&this->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers + 1) + lVar4) =
         *(undefined4 *)
          ((long)(&param_1->fAffixPatternMatchers[0].super_ArraySeriesMatcher.fMatchers + 1) + lVar4
          );
    if (*(char *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -2) !=
        '\0') {
      uprv_free_63(*(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                             lVar4 + -0xe));
    }
    pvVar5 = (void *)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4);
    *(undefined4 *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -6) =
         *(undefined4 *)
          ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -6);
    *(undefined1 *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -2) =
         *(undefined1 *)
          ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -2);
    pvVar6 = *(void **)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                       lVar4 + -0xe);
    if (pvVar5 == pvVar6) {
      pvVar6 = (void *)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4);
      *(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -0xe) =
           pvVar6;
      memcpy(pvVar6,pvVar5,
             (long)*(int *)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray +
                           lVar4 + -6) * 2);
    }
    else {
      *(void **)((long)this->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -0xe) =
           pvVar6;
      *(void **)((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -0xe)
           = pvVar5;
      *(undefined4 *)
       ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -6) = 4;
      *(undefined1 *)
       ((long)param_1->fAffixPatternMatchers[0].fPattern.fBuffer.stackArray + lVar4 + -2) = 0;
    }
    lVar4 = lVar4 + 0x50;
  } while (lVar4 != 0x1e0);
  this->fTokenWarehouse = param_1->fTokenWarehouse;
  return this;
}

Assistant:

AffixMatcherWarehouse() = default;